

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePicker::setMinimumDateTime(DateTimePicker *this,QDateTime *dt)

{
  bool bVar1;
  ulong uVar2;
  QDate lhs;
  DateTimePickerPrivate *this_00;
  DateTimePickerPrivate *pDVar3;
  QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
  *this_01;
  QDateTime *local_78;
  QDateTime local_30 [8];
  QDateTime m;
  QDateTime *dt_local;
  DateTimePicker *this_local;
  
  uVar2 = QDateTime::isValid();
  if ((uVar2 & 1) != 0) {
    lhs.jd = QDateTime::date();
    QDate::QDate((QDate *)&m,100,1,1);
    bVar1 = operator>=(lhs,_m);
    if (bVar1) {
      this_01 = &this->d;
      QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
      ::operator->(this_01);
      QDateTime::toTimeSpec((TimeSpec)local_30);
      this_00 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
                ::operator->(this_01);
      pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(this_01);
      bVar1 = operator>(&pDVar3->maximum,local_30);
      if (bVar1) {
        pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
                 ::operator->(&this->d);
        local_78 = &pDVar3->maximum;
      }
      else {
        local_78 = local_30;
      }
      DateTimePickerPrivate::setRange(this_00,local_30,local_78);
      QDateTime::~QDateTime(local_30);
    }
  }
  return;
}

Assistant:

void
DateTimePicker::setMinimumDateTime( const QDateTime & dt )
{
	if( dt.isValid() && dt.date() >= DATETIMEPICKER_DATE_MIN )
	{
		const QDateTime m = dt.toTimeSpec( d->spec );
		d->setRange( m, ( d->maximum > m ? d->maximum : m ) );
	}
}